

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

typed_expression_t * __thiscall tchecker::ta::system_t::guard(system_t *this,edge_id_t id)

{
  bool bVar1;
  const_reference this_00;
  element_type *peVar2;
  edge_id_t id_local;
  system_t *this_local;
  
  bVar1 = tchecker::system::edges_t::is_edge
                    (&(this->super_system_t).super_system_t.super_edges_t,id);
  if (!bVar1) {
    __assert_fail("is_edge(id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                  ,0x4b,
                  "const tchecker::typed_expression_t &tchecker::ta::system_t::guard(tchecker::edge_id_t) const"
                 );
  }
  this_00 = std::
            vector<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
            ::operator[](&this->_guards,(ulong)id);
  peVar2 = std::
           __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this_00);
  return peVar2;
}

Assistant:

tchecker::typed_expression_t const & system_t::guard(tchecker::edge_id_t id) const
{
  assert(is_edge(id));
  return *_guards[id]._typed_expr;
}